

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

BatchnormLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_batchnorm(NeuralNetworkLayer *this)

{
  BatchnormLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0xa0) {
    clear_layer(this);
    this->_oneof_case_[0] = 0xa0;
    this_00 = (BatchnormLayerParams *)operator_new(0x48);
    BatchnormLayerParams::BatchnormLayerParams(this_00);
    (this->layer_).batchnorm_ = this_00;
  }
  return (BatchnormLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BatchnormLayerParams* NeuralNetworkLayer::mutable_batchnorm() {
  if (!has_batchnorm()) {
    clear_layer();
    set_has_batchnorm();
    layer_.batchnorm_ = new ::CoreML::Specification::BatchnormLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.batchnorm)
  return layer_.batchnorm_;
}